

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastIntrinsics.h
# Opt level: O2

void NFastOps::ExpAvx2<false,true>(float *from,size_t size,float *to)

{
  undefined1 auVar1 [32];
  float fVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  size_t i;
  ulong uVar8;
  undefined1 (*pauVar9) [32];
  float *pfVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  
  uVar7 = size * 4 & 0xffffffffffffff80;
  uVar8 = 0;
  auVar32._8_4_ = 0x43000000;
  auVar32._0_8_ = 0x4300000043000000;
  auVar32._12_4_ = 0x43000000;
  auVar32._16_4_ = 0x43000000;
  auVar32._20_4_ = 0x43000000;
  auVar32._24_4_ = 0x43000000;
  auVar32._28_4_ = 0x43000000;
  auVar33._8_4_ = 0xc2fe0000;
  auVar33._0_8_ = 0xc2fe0000c2fe0000;
  auVar33._12_4_ = 0xc2fe0000;
  auVar33._16_4_ = 0xc2fe0000;
  auVar33._20_4_ = 0xc2fe0000;
  auVar33._24_4_ = 0xc2fe0000;
  auVar33._28_4_ = 0xc2fe0000;
  auVar29._8_4_ = 0xbe9d2ae5;
  auVar29._0_8_ = 0xbe9d2ae5be9d2ae5;
  auVar29._12_4_ = 0xbe9d2ae5;
  auVar29._16_4_ = 0xbe9d2ae5;
  auVar29._20_4_ = 0xbe9d2ae5;
  auVar29._24_4_ = 0xbe9d2ae5;
  auVar29._28_4_ = 0xbe9d2ae5;
  auVar24._8_4_ = 0xbd865310;
  auVar24._0_8_ = 0xbd865310bd865310;
  auVar24._12_4_ = 0xbd865310;
  auVar24._16_4_ = 0xbd865310;
  auVar24._20_4_ = 0xbd865310;
  auVar24._24_4_ = 0xbd865310;
  auVar24._28_4_ = 0xbd865310;
  auVar21._8_4_ = 0xbc5e18ed;
  auVar21._0_8_ = 0xbc5e18edbc5e18ed;
  auVar21._12_4_ = 0xbc5e18ed;
  auVar21._16_4_ = 0xbc5e18ed;
  auVar21._20_4_ = 0xbc5e18ed;
  auVar21._24_4_ = 0xbc5e18ed;
  auVar21._28_4_ = 0xbc5e18ed;
  while( true ) {
    auVar40._28_36_ = in_ZMM7._28_36_;
    auVar47._28_36_ = in_ZMM9._28_36_;
    if (uVar7 <= uVar8) break;
    pfVar10 = (float *)((long)from + uVar8);
    auVar40._0_4_ = *pfVar10 * 1.442695;
    auVar40._4_4_ = pfVar10[1] * 1.442695;
    auVar40._8_4_ = pfVar10[2] * 1.442695;
    auVar40._12_4_ = pfVar10[3] * 1.442695;
    auVar40._16_4_ = pfVar10[4] * 1.442695;
    auVar40._20_4_ = pfVar10[5] * 1.442695;
    auVar40._24_4_ = pfVar10[6] * 1.442695;
    auVar42 = vminps_avx(auVar40._0_32_,auVar32);
    auVar42 = vmaxps_avx(auVar42,auVar33);
    auVar1 = vroundps_avx(auVar42,1);
    auVar38 = vsubps_avx(auVar42,auVar1);
    auVar42 = vcvtps2dq_avx(auVar1);
    auVar47._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar47._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar47._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar47._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar47._16_4_ = auVar38._16_4_ * auVar38._16_4_;
    auVar47._20_4_ = auVar38._20_4_ * auVar38._20_4_;
    auVar47._24_4_ = auVar38._24_4_ * auVar38._24_4_;
    auVar18 = vfmadd213ps_fma(auVar24,auVar38,auVar29);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar47._0_32_,auVar21);
    auVar1 = vsubps_avx(auVar38,auVar47._0_32_);
    auVar18 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar18),auVar38);
    auVar34._0_4_ = auVar18._0_4_ + 1.0;
    auVar34._4_4_ = auVar18._4_4_ + 1.0;
    auVar34._8_4_ = auVar18._8_4_ + 1.0;
    auVar34._12_4_ = auVar18._12_4_ + 1.0;
    auVar34._16_4_ = 0x3f800000;
    auVar34._20_4_ = 0x3f800000;
    auVar34._24_4_ = 0x3f800000;
    auVar34._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar34);
    *(undefined1 (*) [32])((long)to + uVar8) = auVar42;
    pfVar10 = (float *)((long)from + uVar8 + 0x20);
    auVar3._4_4_ = pfVar10[1] * 1.442695;
    auVar3._0_4_ = *pfVar10 * 1.442695;
    auVar3._8_4_ = pfVar10[2] * 1.442695;
    auVar3._12_4_ = pfVar10[3] * 1.442695;
    auVar3._16_4_ = pfVar10[4] * 1.442695;
    auVar3._20_4_ = pfVar10[5] * 1.442695;
    auVar3._24_4_ = pfVar10[6] * 1.442695;
    auVar3._28_4_ = auVar42._28_4_;
    auVar42 = vminps_avx(auVar3,auVar32);
    auVar42 = vmaxps_avx(auVar42,auVar33);
    auVar1 = vroundps_avx(auVar42,1);
    auVar38 = vsubps_avx(auVar42,auVar1);
    auVar42 = vcvtps2dq_avx(auVar1);
    auVar43._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar43._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar43._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar43._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar43._16_4_ = auVar38._16_4_ * auVar38._16_4_;
    auVar43._20_4_ = auVar38._20_4_ * auVar38._20_4_;
    auVar43._24_4_ = auVar38._24_4_ * auVar38._24_4_;
    auVar43._28_4_ = 0;
    auVar18 = vfmadd213ps_fma(auVar24,auVar38,auVar29);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar43,auVar21);
    auVar1 = vsubps_avx(auVar38,auVar43);
    auVar18 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar18),auVar38);
    auVar35._0_4_ = auVar18._0_4_ + 1.0;
    auVar35._4_4_ = auVar18._4_4_ + 1.0;
    auVar35._8_4_ = auVar18._8_4_ + 1.0;
    auVar35._12_4_ = auVar18._12_4_ + 1.0;
    auVar35._16_4_ = 0x3f800000;
    auVar35._20_4_ = 0x3f800000;
    auVar35._24_4_ = 0x3f800000;
    auVar35._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar35);
    *(undefined1 (*) [32])((long)to + uVar8 + 0x20) = auVar42;
    pfVar10 = (float *)((long)from + uVar8 + 0x40);
    auVar4._4_4_ = pfVar10[1] * 1.442695;
    auVar4._0_4_ = *pfVar10 * 1.442695;
    auVar4._8_4_ = pfVar10[2] * 1.442695;
    auVar4._12_4_ = pfVar10[3] * 1.442695;
    auVar4._16_4_ = pfVar10[4] * 1.442695;
    auVar4._20_4_ = pfVar10[5] * 1.442695;
    auVar4._24_4_ = pfVar10[6] * 1.442695;
    auVar4._28_4_ = auVar42._28_4_;
    auVar42 = vminps_avx(auVar4,auVar32);
    auVar42 = vmaxps_avx(auVar42,auVar33);
    auVar1 = vroundps_avx(auVar42,1);
    auVar38 = vsubps_avx(auVar42,auVar1);
    auVar42 = vcvtps2dq_avx(auVar1);
    auVar44._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar44._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar44._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar44._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar44._16_4_ = auVar38._16_4_ * auVar38._16_4_;
    auVar44._20_4_ = auVar38._20_4_ * auVar38._20_4_;
    auVar44._24_4_ = auVar38._24_4_ * auVar38._24_4_;
    auVar44._28_4_ = 0;
    auVar18 = vfmadd213ps_fma(auVar24,auVar38,auVar29);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar44,auVar21);
    auVar1 = vsubps_avx(auVar38,auVar44);
    auVar18 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar18),auVar38);
    auVar36._0_4_ = auVar18._0_4_ + 1.0;
    auVar36._4_4_ = auVar18._4_4_ + 1.0;
    auVar36._8_4_ = auVar18._8_4_ + 1.0;
    auVar36._12_4_ = auVar18._12_4_ + 1.0;
    auVar36._16_4_ = 0x3f800000;
    auVar36._20_4_ = 0x3f800000;
    auVar36._24_4_ = 0x3f800000;
    auVar36._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar36);
    *(undefined1 (*) [32])((long)to + uVar8 + 0x40) = auVar42;
    pfVar10 = (float *)((long)from + uVar8 + 0x60);
    auVar5._4_4_ = pfVar10[1] * 1.442695;
    auVar5._0_4_ = *pfVar10 * 1.442695;
    auVar5._8_4_ = pfVar10[2] * 1.442695;
    auVar5._12_4_ = pfVar10[3] * 1.442695;
    auVar5._16_4_ = pfVar10[4] * 1.442695;
    auVar5._20_4_ = pfVar10[5] * 1.442695;
    auVar5._24_4_ = pfVar10[6] * 1.442695;
    auVar5._28_4_ = auVar42._28_4_;
    auVar42 = vminps_avx(auVar5,auVar32);
    auVar42 = vmaxps_avx(auVar42,auVar33);
    auVar1 = vroundps_avx(auVar42,1);
    auVar38 = vsubps_avx(auVar42,auVar1);
    auVar42 = vcvtps2dq_avx(auVar1);
    auVar45._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar45._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar45._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar45._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar45._16_4_ = auVar38._16_4_ * auVar38._16_4_;
    auVar45._20_4_ = auVar38._20_4_ * auVar38._20_4_;
    auVar45._24_4_ = auVar38._24_4_ * auVar38._24_4_;
    auVar45._28_4_ = 0;
    auVar18 = vfmadd213ps_fma(auVar24,auVar38,auVar29);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar45,auVar21);
    auVar1 = vsubps_avx(auVar38,auVar45);
    auVar18 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar18),auVar38);
    in_ZMM9 = ZEXT1664(auVar18);
    auVar37._0_4_ = auVar18._0_4_ + 1.0;
    auVar37._4_4_ = auVar18._4_4_ + 1.0;
    auVar37._8_4_ = auVar18._8_4_ + 1.0;
    auVar37._12_4_ = auVar18._12_4_ + 1.0;
    auVar37._16_4_ = 0x3f800000;
    auVar37._20_4_ = 0x3f800000;
    auVar37._24_4_ = 0x3f800000;
    auVar37._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar37);
    in_ZMM7 = ZEXT3264(auVar42);
    *(undefined1 (*) [32])((long)to + uVar8 + 0x60) = auVar42;
    uVar8 = uVar8 + 0x80;
  }
  pfVar10 = (float *)((long)from + uVar7);
  pauVar9 = (undefined1 (*) [32])((long)to + uVar7);
  if ((size & 0x10) != 0) {
    auVar41._0_4_ = *pfVar10 * 1.442695;
    auVar41._4_4_ = pfVar10[1] * 1.442695;
    auVar41._8_4_ = pfVar10[2] * 1.442695;
    auVar41._12_4_ = pfVar10[3] * 1.442695;
    auVar41._16_4_ = pfVar10[4] * 1.442695;
    auVar41._20_4_ = pfVar10[5] * 1.442695;
    auVar41._24_4_ = pfVar10[6] * 1.442695;
    auVar41._28_36_ = auVar40._28_36_;
    auVar42 = vminps_avx(auVar41._0_32_,auVar32);
    auVar42 = vmaxps_avx(auVar42,auVar33);
    auVar1 = vroundps_avx(auVar42,1);
    auVar38 = vsubps_avx(auVar42,auVar1);
    auVar42 = vcvtps2dq_avx(auVar1);
    auVar48._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar48._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar48._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar48._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar48._16_4_ = auVar38._16_4_ * auVar38._16_4_;
    auVar48._20_4_ = auVar38._20_4_ * auVar38._20_4_;
    auVar48._24_4_ = auVar38._24_4_ * auVar38._24_4_;
    auVar48._28_36_ = auVar47._28_36_;
    auVar18 = vfmadd213ps_fma(auVar24,auVar38,auVar29);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar48._0_32_,auVar21);
    auVar1 = vsubps_avx(auVar38,auVar48._0_32_);
    auVar18 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar18),auVar38);
    auVar38._0_4_ = auVar18._0_4_ + 1.0;
    auVar38._4_4_ = auVar18._4_4_ + 1.0;
    auVar38._8_4_ = auVar18._8_4_ + 1.0;
    auVar38._12_4_ = auVar18._12_4_ + 1.0;
    auVar38._16_4_ = 0x3f800000;
    auVar38._20_4_ = 0x3f800000;
    auVar38._24_4_ = 0x3f800000;
    auVar38._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar38);
    *pauVar9 = auVar42;
    auVar1._4_4_ = pfVar10[9] * 1.442695;
    auVar1._0_4_ = pfVar10[8] * 1.442695;
    auVar1._8_4_ = pfVar10[10] * 1.442695;
    auVar1._12_4_ = pfVar10[0xb] * 1.442695;
    auVar1._16_4_ = pfVar10[0xc] * 1.442695;
    auVar1._20_4_ = pfVar10[0xd] * 1.442695;
    auVar1._24_4_ = pfVar10[0xe] * 1.442695;
    auVar1._28_4_ = auVar42._28_4_;
    auVar42 = vminps_avx(auVar1,auVar32);
    auVar42 = vmaxps_avx(auVar42,auVar33);
    auVar1 = vroundps_avx(auVar42,1);
    auVar38 = vsubps_avx(auVar42,auVar1);
    auVar42 = vcvtps2dq_avx(auVar1);
    auVar46._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar46._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar46._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar46._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar46._16_4_ = auVar38._16_4_ * auVar38._16_4_;
    auVar46._20_4_ = auVar38._20_4_ * auVar38._20_4_;
    auVar46._24_4_ = auVar38._24_4_ * auVar38._24_4_;
    auVar46._28_4_ = 0;
    auVar18 = vfmadd213ps_fma(auVar24,auVar38,auVar29);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar46,auVar21);
    auVar1 = vsubps_avx(auVar38,auVar46);
    auVar18 = vfmadd213ps_fma(auVar1,ZEXT1632(auVar18),auVar38);
    auVar39._0_4_ = auVar18._0_4_ + 1.0;
    auVar39._4_4_ = auVar18._4_4_ + 1.0;
    auVar39._8_4_ = auVar18._8_4_ + 1.0;
    auVar39._12_4_ = auVar18._12_4_ + 1.0;
    auVar39._16_4_ = 0x3f800000;
    auVar39._20_4_ = 0x3f800000;
    auVar39._24_4_ = 0x3f800000;
    auVar39._28_4_ = 0x3f800000;
    auVar42 = vpslld_avx2(auVar42,0x17);
    auVar42 = vpaddd_avx2(auVar42,auVar39);
    pauVar9[1] = auVar42;
    pauVar9 = pauVar9 + 2;
    pfVar10 = pfVar10 + 0x10;
  }
  if ((size & 8) != 0) {
    auVar42._4_4_ = pfVar10[1] * 1.442695;
    auVar42._0_4_ = *pfVar10 * 1.442695;
    auVar42._8_4_ = pfVar10[2] * 1.442695;
    auVar42._12_4_ = pfVar10[3] * 1.442695;
    auVar42._16_4_ = pfVar10[4] * 1.442695;
    auVar42._20_4_ = pfVar10[5] * 1.442695;
    auVar42._24_4_ = pfVar10[6] * 1.442695;
    auVar42._28_4_ = 0x3fb8aa3b;
    auVar32 = vminps_avx(auVar42,auVar32);
    auVar32 = vmaxps_avx(auVar32,auVar33);
    auVar33 = vroundps_avx(auVar32,1);
    auVar42 = vsubps_avx(auVar32,auVar33);
    auVar32 = vcvtps2dq_avx(auVar33);
    auVar6._4_4_ = auVar42._4_4_ * auVar42._4_4_;
    auVar6._0_4_ = auVar42._0_4_ * auVar42._0_4_;
    auVar6._8_4_ = auVar42._8_4_ * auVar42._8_4_;
    auVar6._12_4_ = auVar42._12_4_ * auVar42._12_4_;
    auVar6._16_4_ = auVar42._16_4_ * auVar42._16_4_;
    auVar6._20_4_ = auVar42._20_4_ * auVar42._20_4_;
    auVar6._24_4_ = auVar42._24_4_ * auVar42._24_4_;
    auVar6._28_4_ = 0xc2fe0000;
    auVar18 = vfmadd213ps_fma(auVar24,auVar42,auVar29);
    auVar18 = vfmadd213ps_fma(auVar21,auVar6,ZEXT1632(auVar18));
    auVar21 = vsubps_avx(auVar42,auVar6);
    auVar18 = vfmadd213ps_fma(auVar21,ZEXT1632(auVar18),auVar42);
    auVar15._0_4_ = auVar18._0_4_ + 1.0;
    auVar15._4_4_ = auVar18._4_4_ + 1.0;
    auVar15._8_4_ = auVar18._8_4_ + 1.0;
    auVar15._12_4_ = auVar18._12_4_ + 1.0;
    auVar15._16_4_ = 0x3f800000;
    auVar15._20_4_ = 0x3f800000;
    auVar15._24_4_ = 0x3f800000;
    auVar15._28_4_ = 0x3f800000;
    auVar21 = vpslld_avx2(auVar32,0x17);
    auVar21 = vpaddd_avx2(auVar21,auVar15);
    *pauVar9 = auVar21;
    pauVar9 = pauVar9 + 1;
    pfVar10 = pfVar10 + 8;
  }
  if ((size & 4) != 0) {
    auVar18._0_4_ = *pfVar10 * 1.442695;
    auVar18._4_4_ = pfVar10[1] * 1.442695;
    auVar18._8_4_ = pfVar10[2] * 1.442695;
    auVar18._12_4_ = pfVar10[3] * 1.442695;
    auVar16._8_4_ = 0x43000000;
    auVar16._0_8_ = 0x4300000043000000;
    auVar16._12_4_ = 0x43000000;
    auVar18 = vminps_avx(auVar18,auVar16);
    auVar17._8_4_ = 0xc2fe0000;
    auVar17._0_8_ = 0xc2fe0000c2fe0000;
    auVar17._12_4_ = 0xc2fe0000;
    auVar18 = vmaxps_avx(auVar18,auVar17);
    auVar16 = vroundps_avx(auVar18,1);
    auVar11 = vsubps_avx(auVar18,auVar16);
    auVar18 = vcvtps2dq_avx(auVar16);
    auVar22._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar22._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar22._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar22._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar25._8_4_ = 0xbe9d2ae5;
    auVar25._0_8_ = 0xbe9d2ae5be9d2ae5;
    auVar25._12_4_ = 0xbe9d2ae5;
    auVar30._8_4_ = 0xbd865310;
    auVar30._0_8_ = 0xbd865310bd865310;
    auVar30._12_4_ = 0xbd865310;
    auVar16 = vfmadd213ps_fma(auVar30,auVar11,auVar25);
    auVar26._8_4_ = 0xbc5e18ed;
    auVar26._0_8_ = 0xbc5e18edbc5e18ed;
    auVar26._12_4_ = 0xbc5e18ed;
    auVar17 = vfmadd213ps_fma(auVar26,auVar22,auVar16);
    auVar16 = vsubps_avx(auVar11,auVar22);
    auVar16 = vfmadd213ps_fma(auVar16,auVar17,auVar11);
    auVar11._0_4_ = auVar16._0_4_ + 1.0;
    auVar11._4_4_ = auVar16._4_4_ + 1.0;
    auVar11._8_4_ = auVar16._8_4_ + 1.0;
    auVar11._12_4_ = auVar16._12_4_ + 1.0;
    auVar18 = vpslld_avx(auVar18,0x17);
    auVar18 = vpaddd_avx(auVar18,auVar11);
    *(undefined1 (*) [16])*pauVar9 = auVar18;
    pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
    pfVar10 = pfVar10 + 4;
  }
  if ((size & 2) != 0) {
    auVar12._0_4_ = (float)*(undefined8 *)pfVar10 * 1.442695;
    auVar12._4_4_ = (float)((ulong)*(undefined8 *)pfVar10 >> 0x20) * 1.442695;
    auVar12._8_8_ = 0;
    auVar19._8_4_ = 0x43000000;
    auVar19._0_8_ = 0x4300000043000000;
    auVar19._12_4_ = 0x43000000;
    auVar18 = vminps_avx(auVar12,auVar19);
    auVar20._8_4_ = 0xc2fe0000;
    auVar20._0_8_ = 0xc2fe0000c2fe0000;
    auVar20._12_4_ = 0xc2fe0000;
    auVar18 = vmaxps_avx(auVar18,auVar20);
    auVar16 = vroundps_avx(auVar18,1);
    auVar11 = vsubps_avx(auVar18,auVar16);
    auVar18 = vcvtps2dq_avx(auVar16);
    auVar23._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar23._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar23._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar23._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar27._8_4_ = 0xbe9d2ae5;
    auVar27._0_8_ = 0xbe9d2ae5be9d2ae5;
    auVar27._12_4_ = 0xbe9d2ae5;
    auVar31._8_4_ = 0xbd865310;
    auVar31._0_8_ = 0xbd865310bd865310;
    auVar31._12_4_ = 0xbd865310;
    auVar16 = vfmadd213ps_fma(auVar31,auVar11,auVar27);
    auVar28._8_4_ = 0xbc5e18ed;
    auVar28._0_8_ = 0xbc5e18edbc5e18ed;
    auVar28._12_4_ = 0xbc5e18ed;
    auVar17 = vfmadd213ps_fma(auVar28,auVar23,auVar16);
    auVar16 = vsubps_avx(auVar11,auVar23);
    auVar16 = vfmadd213ps_fma(auVar16,auVar17,auVar11);
    auVar13._0_4_ = auVar16._0_4_ + 1.0;
    auVar13._4_4_ = auVar16._4_4_ + 1.0;
    auVar13._8_4_ = auVar16._8_4_ + 1.0;
    auVar13._12_4_ = auVar16._12_4_ + 1.0;
    auVar18 = vpslld_avx(auVar18,0x17);
    auVar18 = vpaddd_avx(auVar18,auVar13);
    *(long *)*pauVar9 = auVar18._0_8_;
    pauVar9 = (undefined1 (*) [32])(*pauVar9 + 8);
    pfVar10 = pfVar10 + 2;
  }
  if ((size & 1) != 0) {
    auVar14._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
    auVar14._0_4_ = *pfVar10 * 1.442695;
    auVar18 = vminss_avx(auVar14,ZEXT416(0x43000000));
    auVar18 = vmaxss_avx(auVar18,ZEXT416(0xc2fe0000));
    auVar16 = vroundss_avx(auVar18,auVar18,1);
    fVar2 = auVar18._0_4_ - auVar16._0_4_;
    auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbd865310),0),ZEXT416((uint)fVar2),
                              ZEXT416(0xbe9d2ae5));
    auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)(fVar2 * fVar2)),ZEXT416(0xbc5e18ed));
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 - fVar2 * fVar2)),auVar18,ZEXT416((uint)fVar2));
    auVar18 = vcvtps2dq_avx(auVar16);
    auVar18 = vpslld_avx(auVar18,0x17);
    auVar18 = vpaddd_avx(auVar18,ZEXT416((uint)(auVar11._0_4_ + 1.0)));
    *(int *)*pauVar9 = auVar18._0_4_;
  }
  return;
}

Assistant:

FORCE_INLINE void AVXExp(const P_Type1& from, size_t size, P_Type2&& to) noexcept {
        AVX_FLOAT_EXP_LIKE_FUNC_CALL((AVXCopy<false, I_OutAligned>), S_Pow, size * c_elem_size, c::c_1_over_ln_2);
    }